

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O3

void Ndr_NtkPrintObjects(Wln_Ntk_t *pNtk)

{
  Wln_Vec_t *pWVar1;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  puts("Node IDs and their fanins:");
  if (1 < (pNtk->vTypes).nSize) {
    uVar5 = 1;
    lVar9 = 0x18;
    do {
      printf("%5d = ",uVar5 & 0xffffffff);
      pWVar1 = pNtk->vFanins;
      uVar4 = (ulong)(uint)pWVar1[uVar5].nSize;
      uVar7 = 0;
      if (pWVar1[uVar5].nSize < 1) {
LAB_00382b98:
        iVar6 = (int)uVar7 + -4;
        do {
          printf("      ");
          iVar6 = iVar6 + 1;
        } while (iVar6 != 0);
      }
      else {
        uVar7 = 0;
        lVar10 = lVar9;
        do {
          uVar8 = uVar7;
          if ((int)uVar4 < 3) {
            piVar3 = (int *)((long)&pWVar1->nCap + lVar10);
          }
          else {
            piVar3 = pWVar1[uVar5].field_2.pArray[0] + uVar8;
          }
          if (*piVar3 != 0) {
            printf("%5d ");
            pWVar1 = pNtk->vFanins;
          }
          uVar7 = uVar8 + 1;
          uVar4 = (ulong)pWVar1[uVar5].nSize;
          lVar10 = lVar10 + 4;
        } while ((long)uVar7 < (long)uVar4);
        if (uVar8 < 3) goto LAB_00382b98;
      }
      if ((long)(pNtk->vNameIds).nSize <= (long)uVar5) {
LAB_00382c81:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      printf("    Name Id %d ",(ulong)(uint)(pNtk->vNameIds).pArray[uVar5]);
      lVar10 = (long)(pNtk->vTypes).nSize;
      if (lVar10 <= (long)uVar5) goto LAB_00382c81;
      if ((pNtk->vTypes).pArray[uVar5] == 3) {
        paVar2 = &pNtk->vFanins[uVar5].field_2;
        if (2 < pNtk->vFanins[uVar5].nSize) {
          paVar2 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar2->pArray[0];
        }
        if (paVar2->Array[1] < (pNtk->vCis).nSize - (pNtk->vFfs).nSize) {
          printf("  pi  ");
          lVar10 = (long)(pNtk->vTypes).nSize;
        }
      }
      if (lVar10 <= (long)uVar5) goto LAB_00382c81;
      if ((pNtk->vTypes).pArray[uVar5] == 4) {
        paVar2 = &pNtk->vFanins[uVar5].field_2;
        if (2 < pNtk->vFanins[uVar5].nSize) {
          paVar2 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar2->pArray[0];
        }
        if (paVar2->Array[1] < (pNtk->vCos).nSize - (pNtk->vFfs).nSize) {
          printf("  po  ");
        }
      }
      putchar(10);
      uVar5 = uVar5 + 1;
      lVar9 = lVar9 + 0x10;
    } while ((long)uVar5 < (long)(pNtk->vTypes).nSize);
  }
  return;
}

Assistant:

void Ndr_NtkPrintObjects( Wln_Ntk_t * pNtk )
{
    int k, iObj, iFanin;
    printf( "Node IDs and their fanins:\n" );
    Wln_NtkForEachObj( pNtk, iObj )
    {
        printf( "%5d = ", iObj );
        Wln_ObjForEachFanin( pNtk, iObj, iFanin, k )
            printf( "%5d ", iFanin );
        for (      ; k < 4; k++ )
            printf( "      " );
        printf( "    Name Id %d ", Wln_ObjNameId(pNtk, iObj) );
        if ( Wln_ObjIsPi(pNtk, iObj) )
            printf( "  pi  " );
        if ( Wln_ObjIsPo(pNtk, iObj) )
            printf( "  po  " );
        printf( "\n" );
    }
}